

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::emplace<QTextEdit::ExtraSelection_const&>
          (QGenericArrayOps<QTextEdit::ExtraSelection> *this,qsizetype i,ExtraSelection *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QTextEdit::ExtraSelection> *in_RSI;
  QArrayDataPointer<QTextEdit::ExtraSelection> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  ExtraSelection tmp;
  ExtraSelection *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff74;
  byte bVar6;
  GrowthPosition where;
  Inserter local_70;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QTextEdit::ExtraSelection>::needsDetach
                    ((QArrayDataPointer<QTextEdit::ExtraSelection> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QTextEdit::ExtraSelection> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QTextEdit::ExtraSelection>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QTextEdit::ExtraSelection>::end
                ((QArrayDataPointer<QTextEdit::ExtraSelection> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      QTextEdit::ExtraSelection::ExtraSelection
                ((ExtraSelection *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0072e2d8;
    }
    if ((in_RSI == (QArrayDataPointer<QTextEdit::ExtraSelection> *)0x0) &&
       (qVar3 = QArrayDataPointer<QTextEdit::ExtraSelection>::freeSpaceAtBegin(in_RDI), qVar3 != 0))
    {
      QArrayDataPointer<QTextEdit::ExtraSelection>::begin
                ((QArrayDataPointer<QTextEdit::ExtraSelection> *)0x72e18a);
      QTextEdit::ExtraSelection::ExtraSelection
                ((ExtraSelection *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0072e2d8;
    }
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextEdit::ExtraSelection::ExtraSelection
            ((ExtraSelection *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QTextEdit::ExtraSelection> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QTextEdit::ExtraSelection> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QTextEdit::ExtraSelection>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff74,uVar2))),
             (ExtraSelection **)in_RDI,
             (QArrayDataPointer<QTextEdit::ExtraSelection> *)
             CONCAT17(uVar5,in_stack_ffffffffffffff60));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_70,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff74,uVar2))),
                        (qsizetype)in_RDI,
                        (ExtraSelection *)CONCAT17(uVar5,in_stack_ffffffffffffff60));
    Inserter::~Inserter(&local_70);
  }
  else {
    QArrayDataPointer<QTextEdit::ExtraSelection>::begin
              ((QArrayDataPointer<QTextEdit::ExtraSelection> *)0x72e268);
    QTextEdit::ExtraSelection::ExtraSelection
              ((ExtraSelection *)CONCAT17(uVar5,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
              );
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QTextEdit::ExtraSelection::~ExtraSelection
            ((ExtraSelection *)CONCAT17(uVar5,in_stack_ffffffffffffff60));
LAB_0072e2d8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }